

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IT8951.c
# Opt level: O0

void IT8951MemBurstWriteProc(uint32_t ulMemAddr,uint32_t ulWriteSize,uint16_t *pSrcBuf)

{
  uint local_1c;
  uint32_t i;
  uint16_t *pSrcBuf_local;
  uint32_t ulWriteSize_local;
  uint32_t ulMemAddr_local;
  
  IT8951MemBurstWrite(ulMemAddr,ulWriteSize);
  for (local_1c = 0; local_1c < ulWriteSize; local_1c = local_1c + 1) {
    LCDWriteData(pSrcBuf[local_1c]);
  }
  IT8951MemBurstEnd();
  return;
}

Assistant:

void IT8951MemBurstWriteProc(uint32_t ulMemAddr , uint32_t ulWriteSize, uint16_t* pSrcBuf )
{
    
    uint32_t i;
 
    //Send Burst Write Start Cmd and Args
    IT8951MemBurstWrite(ulMemAddr , ulWriteSize);
 
    //Burst Write Data
    for(i=0;i<ulWriteSize;i++)
    {
        LCDWriteData(pSrcBuf[i]);
    }
 
    //Send Burst End Cmd
    IT8951MemBurstEnd();
}